

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall soplex::SPxSteepPR<double>::setupWeights(SPxSteepPR<double> *this,Type type)

{
  VectorBase<double> *this_00;
  VectorBase<double> *this_01;
  int iVar1;
  SPxOut *pSVar2;
  SVSetBase<double> *pSVar3;
  Item *pIVar4;
  DataKey *pDVar5;
  char cVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  SPxSolverBase<double> *pSVar12;
  long lVar13;
  pointer pdVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  Nonzero<double> *pNVar18;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Verbosity old_verbosity;
  shared_ptr<soplex::Tolerances> local_98;
  undefined4 local_84;
  SSVectorBase<double> local_80;
  
  pSVar12 = (this->super_SPxPricer<double>).thesolver;
  this_00 = &pSVar12->weights;
  this_01 = &pSVar12->coWeights;
  if (this->setup == DEFAULT) {
    if (type == ENTER) {
      if (pSVar12->weightsAreSetup == false) {
        iVar11 = (pSVar12->thecovectors->set).thenum;
        iVar19 = 0;
        iVar17 = 0;
      }
      else {
        iVar11 = (pSVar12->thecovectors->set).thenum;
        iVar19 = (int)((ulong)((long)(pSVar12->coWeights).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pSVar12->coWeights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        if (iVar11 < iVar19) {
          iVar19 = iVar11;
        }
        iVar1 = (pSVar12->thevectors->set).thenum;
        iVar17 = (int)((ulong)((long)(pSVar12->weights).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pSVar12->weights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        if (iVar1 < iVar17) {
          iVar17 = iVar1;
        }
      }
      std::vector<double,_std::allocator<double>_>::resize(&this_01->val,(long)iVar11);
      auVar9 = _DAT_003561b0;
      auVar8 = _DAT_003561a0;
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
      iVar11 = (pSVar12->thecovectors->set).thenum;
      lVar13 = (long)iVar11;
      if (iVar19 < iVar11) {
        lVar16 = (lVar13 - iVar19) + -1;
        auVar22._8_4_ = (int)lVar16;
        auVar22._0_8_ = lVar16;
        auVar22._12_4_ = (int)((ulong)lVar16 >> 0x20);
        pdVar14 = (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar13 + -1;
        uVar15 = 0;
        auVar22 = auVar22 ^ _DAT_003561b0;
        do {
          auVar27._8_4_ = (int)uVar15;
          auVar27._0_8_ = uVar15;
          auVar27._12_4_ = (int)(uVar15 >> 0x20);
          auVar26 = (auVar27 | auVar8) ^ auVar9;
          if ((bool)(~(auVar26._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar26._0_4_ ||
                      auVar22._4_4_ < auVar26._4_4_) & 1)) {
            *pdVar14 = 2.0;
          }
          if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
              auVar26._12_4_ <= auVar22._12_4_) {
            pdVar14[-1] = 2.0;
          }
          uVar15 = uVar15 + 2;
          pdVar14 = pdVar14 + -2;
        } while (((lVar13 - iVar19) + 1U & 0xfffffffffffffffe) != uVar15);
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&this_00->val,(long)(pSVar12->thevectors->set).thenum);
      auVar9 = _DAT_003561b0;
      auVar8 = _DAT_003561a0;
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
      iVar11 = (pSVar12->thevectors->set).thenum;
      lVar13 = (long)iVar11;
      if (iVar17 < iVar11) {
        lVar16 = (lVar13 - iVar17) + -1;
        auVar23._8_4_ = (int)lVar16;
        auVar23._0_8_ = lVar16;
        auVar23._12_4_ = (int)((ulong)lVar16 >> 0x20);
        pdVar14 = (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar13 + -1;
        uVar15 = 0;
        auVar23 = auVar23 ^ _DAT_003561b0;
        do {
          auVar28._8_4_ = (int)uVar15;
          auVar28._0_8_ = uVar15;
          auVar28._12_4_ = (int)(uVar15 >> 0x20);
          auVar26 = (auVar28 | auVar8) ^ auVar9;
          if ((bool)(~(auVar26._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar26._0_4_ ||
                      auVar23._4_4_ < auVar26._4_4_) & 1)) {
            *pdVar14 = 1.0;
          }
          if ((auVar26._12_4_ != auVar23._12_4_ || auVar26._8_4_ <= auVar23._8_4_) &&
              auVar26._12_4_ <= auVar23._12_4_) {
            pdVar14[-1] = 1.0;
          }
          uVar15 = uVar15 + 2;
          pdVar14 = pdVar14 + -2;
        } while (((lVar13 - iVar17) + 1U & 0xfffffffffffffffe) != uVar15);
      }
    }
    else {
      if (pSVar12->weightsAreSetup == false) {
        iVar11 = (pSVar12->thecovectors->set).thenum;
        iVar17 = 0;
      }
      else {
        iVar11 = (pSVar12->thecovectors->set).thenum;
        iVar17 = (int)((ulong)((long)(pSVar12->coWeights).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pSVar12->coWeights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
        if (iVar11 < iVar17) {
          iVar17 = iVar11;
        }
      }
      std::vector<double,_std::allocator<double>_>::resize(&this_01->val,(long)iVar11);
      auVar9 = _DAT_003561b0;
      auVar8 = _DAT_003561a0;
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
      iVar11 = (pSVar12->thecovectors->set).thenum;
      lVar13 = (long)iVar11;
      if (iVar17 < iVar11) {
        lVar16 = (lVar13 - iVar17) + -1;
        auVar21._8_4_ = (int)lVar16;
        auVar21._0_8_ = lVar16;
        auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
        pdVar14 = (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar13 + -1;
        uVar15 = 0;
        auVar21 = auVar21 ^ _DAT_003561b0;
        do {
          auVar25._8_4_ = (int)uVar15;
          auVar25._0_8_ = uVar15;
          auVar25._12_4_ = (int)(uVar15 >> 0x20);
          auVar26 = (auVar25 | auVar8) ^ auVar9;
          if ((bool)(~(auVar26._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar26._0_4_ ||
                      auVar21._4_4_ < auVar26._4_4_) & 1)) {
            *pdVar14 = 1.0;
          }
          if ((auVar26._12_4_ != auVar21._12_4_ || auVar26._8_4_ <= auVar21._8_4_) &&
              auVar26._12_4_ <= auVar21._12_4_) {
            pdVar14[-1] = 1.0;
          }
          uVar15 = uVar15 + 2;
          pdVar14 = pdVar14 + -2;
        } while (((lVar13 - iVar17) + 1U & 0xfffffffffffffffe) != uVar15);
      }
    }
  }
  else {
    pSVar2 = pSVar12->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (2 < (int)pSVar2->m_verbosity)) {
      local_84 = 3;
      local_80.super_IdxSet._vptr_IdxSet._0_4_ = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],
                 " --- initializing steepest edge multipliers",0x2b);
      cVar6 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18)
                      + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_80);
    }
    std::vector<double,_std::allocator<double>_>::resize
              (&this_01->val,
               (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
    auVar9 = _DAT_003561b0;
    auVar8 = _DAT_003561a0;
    if (type == ENTER) {
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
      iVar11 = (pSVar12->thecovectors->set).thenum;
      lVar13 = (long)iVar11;
      if (0 < lVar13) {
        lVar16 = lVar13 + -1;
        auVar26._8_4_ = (int)lVar16;
        auVar26._0_8_ = lVar16;
        auVar26._12_4_ = (int)((ulong)lVar16 >> 0x20);
        pdVar14 = (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar13 + -1;
        uVar15 = 0;
        auVar26 = auVar26 ^ _DAT_003561b0;
        do {
          auVar24._8_4_ = (int)uVar15;
          auVar24._0_8_ = uVar15;
          auVar24._12_4_ = (int)(uVar15 >> 0x20);
          auVar24 = (auVar24 | auVar8) ^ auVar9;
          if ((bool)(~(auVar24._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar24._0_4_ ||
                      auVar26._4_4_ < auVar24._4_4_) & 1)) {
            *pdVar14 = 1.0;
          }
          if ((auVar24._12_4_ != auVar26._12_4_ || auVar24._8_4_ <= auVar26._8_4_) &&
              auVar24._12_4_ <= auVar26._12_4_) {
            pdVar14[-1] = 1.0;
          }
          uVar15 = uVar15 + 2;
          pdVar14 = pdVar14 + -2;
        } while ((iVar11 + 1U & 0xfffffffe) != uVar15);
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&this_00->val,(long)(pSVar12->thevectors->set).thenum);
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
      pSVar3 = pSVar12->thevectors;
      lVar13 = (long)(pSVar3->set).thenum;
      if (0 < lVar13) {
        pIVar4 = (pSVar3->set).theitem;
        pDVar5 = (pSVar3->set).thekey;
        pdVar14 = (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar11 = pDVar5[lVar13 + -1].idx;
          iVar17 = pIVar4[iVar11].data.super_SVectorBase<double>.memused;
          dVar20 = 1.0;
          if (iVar17 != 0) {
            pNVar18 = pIVar4[iVar11].data.super_SVectorBase<double>.m_elem;
            dVar20 = 0.0;
            do {
              pdVar7 = &pNVar18->val;
              pNVar18 = pNVar18 + 1;
              dVar20 = dVar20 + *pdVar7 * *pdVar7;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
            dVar20 = dVar20 + 1.0;
          }
          pdVar14[lVar13 + -1] = dVar20;
          bVar10 = 1 < lVar13;
          lVar13 = lVar13 + -1;
        } while (bVar10);
      }
    }
    else {
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
      iVar11 = (pSVar12->thecovectors->set).thenum;
      local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pSVar12->super_SPxLPBase<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (pSVar12->super_SPxLPBase<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SSVectorBase<double>::SSVectorBase(&local_80,iVar11,&local_98);
      if (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      lVar13 = (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
      if (0 < lVar13) {
        uVar15 = lVar13 + 1;
        lVar13 = lVar13 << 5;
        do {
          bVar10 = SPxSolverBase<double>::isTimeLimitReached
                             ((this->super_SPxPricer<double>).thesolver,false);
          if (bVar10) break;
          pSVar12 = (this->super_SPxPricer<double>).thesolver;
          SPxBasisBase<double>::coSolve
                    (&pSVar12->super_SPxBasisBase<double>,&local_80,
                     (SVectorBase<double> *)
                     ((long)&(pSVar12->unitVecs).data.
                             super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].super_SVectorBase<double>
                             .m_elem + lVar13));
          dVar20 = SSVectorBase<double>::length2(&local_80);
          (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15 - 2] = dVar20;
          uVar15 = uVar15 - 1;
          lVar13 = lVar13 + -0x20;
        } while (1 < uVar15);
      }
      SSVectorBase<double>::~SSVectorBase(&local_80);
      pSVar12 = (this->super_SPxPricer<double>).thesolver;
    }
  }
  pSVar12->weightsAreSetup = true;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}